

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void RegisterNetRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffd88;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterNetRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterNetRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,"network",(allocator<char> *)&stack0xfffffffffffffd9f);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_40);
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"network",(allocator<char> *)&stack0xfffffffffffffd9e);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 1,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"network",(allocator<char> *)&stack0xfffffffffffffd9d);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 2,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>
                (local_a0,"network",(allocator<char> *)&stack0xfffffffffffffd9c);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 3,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"network",(allocator<char> *)&stack0xfffffffffffffd9b);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 4,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_e0,"network",(allocator<char> *)&stack0xfffffffffffffd9a);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 5,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"network",(allocator<char> *)&stack0xfffffffffffffd99);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 6,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_100);
      std::__cxx11::string::string<std::allocator<char>>
                (local_120,"network",(allocator<char> *)&stack0xfffffffffffffd98);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 7,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_120);
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"network",(allocator<char> *)&stack0xfffffffffffffd97);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 8,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_140);
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"network",(allocator<char> *)&stack0xfffffffffffffd96);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 9,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_160);
      std::__cxx11::string::string<std::allocator<char>>
                (local_180,"network",(allocator<char> *)&stack0xfffffffffffffd95);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 10,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_180);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a0,"network",(allocator<char> *)&stack0xfffffffffffffd94);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xb,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c0,"network",(allocator<char> *)&stack0xfffffffffffffd93);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xc,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_1c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e0,"network",(allocator<char> *)&stack0xfffffffffffffd92);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xd,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_1e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_200,"hidden",(allocator<char> *)&stack0xfffffffffffffd91);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xe,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_200);
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"hidden",(allocator<char> *)&stack0xfffffffffffffd90);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xf,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_220);
      std::__cxx11::string::string<std::allocator<char>>
                (local_240,"hidden",(allocator<char> *)&stack0xfffffffffffffd8f);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0x10,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)local_240);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffda0,"hidden",
                 (allocator<char> *)&stack0xfffffffffffffd8e);
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0x11,in_stack_fffffffffffffd88,
                 (RpcMethodFnType)&stack0xfffffffffffffda0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterNetRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterNetRPCCommands::commands;
  for (lVar2 = 0x900; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterNetRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"network", &getconnectioncount},
        {"network", &ping},
        {"network", &getpeerinfo},
        {"network", &addnode},
        {"network", &disconnectnode},
        {"network", &getaddednodeinfo},
        {"network", &getnettotals},
        {"network", &getnetworkinfo},
        {"network", &setban},
        {"network", &listbanned},
        {"network", &clearbanned},
        {"network", &setnetworkactive},
        {"network", &getnodeaddresses},
        {"network", &getaddrmaninfo},
        {"hidden", &addconnection},
        {"hidden", &addpeeraddress},
        {"hidden", &sendmsgtopeer},
        {"hidden", &getrawaddrman},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}